

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::~EigenDecompositionSquare
          (EigenDecompositionSquare<float,_1> *this)

{
  EigenDecompositionSquare<float,_1> *in_RDI;
  
  ~EigenDecompositionSquare(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionSquare() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gEMatrices[i]);
		free(gIMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gEMatrices);
	free(gIMatrices);
	free(gEigenValues);
	free(matrixTmp);
}